

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3auxBestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  char cVar1;
  sqlite3_index_constraint *psVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  uVar11 = 0;
  uVar10 = (ulong)(uint)pInfo->nConstraint;
  if (pInfo->nConstraint < 1) {
    uVar10 = uVar11;
  }
  uVar7 = 0xffffffff;
  lVar12 = 5;
  uVar4 = 0xffffffff;
  uVar3 = 0xffffffff;
  uVar5 = 0xffffffff;
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    psVar2 = pInfo->aConstraint;
    if (*(char *)((long)&psVar2->iColumn + lVar12) != '\0') {
      cVar1 = *(char *)((long)psVar2 + lVar12 + -1);
      iVar6 = *(int *)((long)psVar2 + lVar12 + -5);
      if (iVar6 == 0) {
        if (cVar1 == '\x02') {
          uVar5 = (uint)uVar11;
        }
        if ((cVar1 - 8U & 0xf7) == 0) {
          uVar4 = uVar11 & 0xffffffff;
        }
        if (cVar1 == '\x04') {
          uVar7 = uVar11 & 0xffffffff;
        }
        if (cVar1 == ' ') {
          uVar7 = uVar11 & 0xffffffff;
        }
      }
      uVar8 = uVar11 & 0xffffffff;
      if (cVar1 != '\x02') {
        uVar8 = uVar3;
      }
      if (iVar6 == 4) {
        uVar3 = uVar8;
      }
    }
    lVar12 = lVar12 + 0xc;
  }
  if ((int)uVar5 < 0) {
    pInfo->idxNum = 0;
    pInfo->estimatedCost = 20000.0;
    if ((int)uVar7 < 0) {
      iVar6 = 1;
      iVar9 = 4;
      dVar13 = 20000.0;
    }
    else {
      pInfo->idxNum = 2;
      pInfo->aConstraintUsage[uVar7].argvIndex = 1;
      pInfo->estimatedCost = 10000.0;
      iVar6 = 2;
      iVar9 = 6;
      dVar13 = 10000.0;
    }
    if (-1 < (int)uVar4) {
      pInfo->idxNum = iVar9;
      pInfo->aConstraintUsage[uVar4].argvIndex = iVar6;
      iVar6 = iVar6 + 1;
      dVar13 = dVar13 * 0.5;
      pInfo->estimatedCost = dVar13;
    }
  }
  else {
    pInfo->idxNum = 1;
    pInfo->aConstraintUsage[uVar5].argvIndex = 1;
    pInfo->estimatedCost = 5.0;
    iVar6 = 2;
    dVar13 = 5.0;
  }
  if (-1 < (int)uVar3) {
    pInfo->aConstraintUsage[uVar3].argvIndex = iVar6;
    pInfo->estimatedCost = dVar13 + -1.0;
  }
  return 0;
}

Assistant:

static int fts3auxBestIndexMethod(
  sqlite3_vtab *pVTab, 
  sqlite3_index_info *pInfo
){
  int i;
  int iEq = -1;
  int iGe = -1;
  int iLe = -1;
  int iLangid = -1;
  int iNext = 1;                  /* Next free argvIndex value */

  UNUSED_PARAMETER(pVTab);

  /* This vtab delivers always results in "ORDER BY term ASC" order. */
  if( pInfo->nOrderBy==1 
   && pInfo->aOrderBy[0].iColumn==0 
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  /* Search for equality and range constraints on the "term" column. 
  ** And equality constraints on the hidden "languageid" column. */
  for(i=0; i<pInfo->nConstraint; i++){
    if( pInfo->aConstraint[i].usable ){
      int op = pInfo->aConstraint[i].op;
      int iCol = pInfo->aConstraint[i].iColumn;

      if( iCol==0 ){
        if( op==SQLITE_INDEX_CONSTRAINT_EQ ) iEq = i;
        if( op==SQLITE_INDEX_CONSTRAINT_LT ) iLe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_LE ) iLe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_GT ) iGe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_GE ) iGe = i;
      }
      if( iCol==4 ){
        if( op==SQLITE_INDEX_CONSTRAINT_EQ ) iLangid = i;
      }
    }
  }

  if( iEq>=0 ){
    pInfo->idxNum = FTS4AUX_EQ_CONSTRAINT;
    pInfo->aConstraintUsage[iEq].argvIndex = iNext++;
    pInfo->estimatedCost = 5;
  }else{
    pInfo->idxNum = 0;
    pInfo->estimatedCost = 20000;
    if( iGe>=0 ){
      pInfo->idxNum += FTS4AUX_GE_CONSTRAINT;
      pInfo->aConstraintUsage[iGe].argvIndex = iNext++;
      pInfo->estimatedCost /= 2;
    }
    if( iLe>=0 ){
      pInfo->idxNum += FTS4AUX_LE_CONSTRAINT;
      pInfo->aConstraintUsage[iLe].argvIndex = iNext++;
      pInfo->estimatedCost /= 2;
    }
  }
  if( iLangid>=0 ){
    pInfo->aConstraintUsage[iLangid].argvIndex = iNext++;
    pInfo->estimatedCost--;
  }

  return SQLITE_OK;
}